

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

void gen_trigrams(uint8_t *mem,uint64_t size,TrigramCallback *cb)

{
  uint uVar1;
  ulong in_RSI;
  undefined1 *in_RDI;
  uint64_t offset;
  uint32_t gram3;
  ulong uVar2;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (2 < in_RSI) {
    uVar1 = (uint)CONCAT11(*in_RDI,in_RDI[1]);
    for (uVar2 = 2; uVar2 < in_RSI; uVar2 = uVar2 + 1) {
      uVar1 = (uVar1 & 0xffff) << 8 | (uint)(byte)in_RDI[uVar2];
      std::function<void_(unsigned_int)>::operator()
                ((function<void_(unsigned_int)> *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                 (uint)(uVar2 >> 0x20));
    }
  }
  return;
}

Assistant:

void gen_trigrams(const uint8_t *mem, uint64_t size,
                  const TrigramCallback &cb) {
    if (size < 3) {
        return;
    }

    uint32_t gram3 = (mem[0] << 8U) | mem[1];

    for (uint64_t offset = 2; offset < size; offset++) {
        gram3 = ((gram3 & 0xFFFFU) << 8U) | mem[offset];
        cb(gram3);
    }
}